

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_dec
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  dec_writer f;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  num_digits = internal::count_digits(this->abs_value);
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,num_digits,prefix,this->spec,f);
  return;
}

Assistant:

void on_dec() {
      int num_digits = internal::count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), spec,
                       dec_writer{abs_value, num_digits});
    }